

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid)

{
  uint node0;
  uint node1;
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  REF_BOOL has_side;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  uint local_4c;
  double local_48;
  REF_EDGE local_40;
  REF_NODE local_38;
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar2 = ref_edge_create(&local_40,ref_grid);
  if (uVar2 == 0) {
    if (0 < local_40->n) {
      lVar7 = 0;
      local_38 = pRVar1;
      do {
        node0 = local_40->e2n[lVar7 * 2];
        node1 = local_40->e2n[lVar7 * 2 + 1];
        uVar2 = ref_node_ratio(local_38,node0,node1,&local_48);
        if (uVar2 != 0) {
          pcVar6 = "ratio";
          uVar3 = 0x34;
          goto LAB_00113b75;
        }
        if (local_48 < ref_grid->adapt->post_min_ratio + 0.1) {
          uVar2 = ref_cell_has_side(ref_cell,node0,node1,(REF_BOOL *)&local_4c);
          if (uVar2 != 0) {
            pcVar6 = "side";
            uVar3 = 0x36;
            goto LAB_00113b75;
          }
          uVar4 = 0;
          uVar5 = 0;
          if ((-1 < (int)node0) && ((int)node0 < ref_cell->ref_adj->nnode)) {
            uVar5 = (ulong)(ref_cell->ref_adj->first[node0] != -1);
          }
          if ((-1 < (int)node1) && ((int)node1 < ref_cell->ref_adj->nnode)) {
            uVar4 = (ulong)(ref_cell->ref_adj->first[node1] != -1);
          }
          printf("ratio %f bound nodes %d %d tri edge %d\n",local_48,uVar5,uVar4,(ulong)local_4c);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_40->n);
    }
    uVar2 = 0;
  }
  else {
    pcVar6 = "orig edges";
    uVar3 = 0x30;
LAB_00113b75:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar3,"ref_collapse_diagnostics",(ulong)uVar2,pcVar6);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_DBL edge_ratio;
  REF_BOOL has_side;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    if (edge_ratio < 0.1 + ref_grid_adapt(ref_grid, post_min_ratio)) {
      RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side");
      printf("ratio %f bound nodes %d %d tri edge %d\n", edge_ratio,
             !ref_cell_node_empty(ref_cell, node0),
             !ref_cell_node_empty(ref_cell, node1), has_side);
    }
  }

  return REF_SUCCESS;
}